

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

bool logValueDistribution
               (HighsLogOptions *log_options,HighsValueDistribution *value_distribution,HighsInt mu)

{
  uint uVar1;
  uint uVar2;
  pointer pcVar3;
  pointer piVar4;
  pointer pdVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  string value_name;
  undefined1 *local_60 [2];
  undefined1 local_50 [20];
  undefined4 local_3c;
  long local_38;
  
  if (0 < value_distribution->sum_count_) {
    uVar1 = value_distribution->num_count_;
    uVar11 = (ulong)uVar1;
    if (-1 < (int)uVar1) {
      iVar7 = std::__cxx11::string::compare((char *)value_distribution);
      if (iVar7 != 0) {
        highsLogDev(log_options,kInfo,"\n%s\n",
                    (value_distribution->distribution_name_)._M_dataplus._M_p);
      }
      local_60[0] = local_50;
      pcVar3 = (value_distribution->value_name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar3,
                 pcVar3 + (value_distribution->value_name_)._M_string_length);
      uVar10 = value_distribution->num_one_ + value_distribution->num_zero_;
      dVar13 = value_distribution->min_value_;
      piVar4 = (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        uVar10 = uVar10 + piVar4[lVar8];
        lVar8 = lVar8 + 1;
      } while (uVar11 + 1 != lVar8);
      local_3c = (undefined4)CONCAT71((int7)((ulong)piVar4 >> 8),uVar10 != 0);
      if (uVar10 != 0) {
        highsLogDev(log_options,kInfo,"Min value = %g\n");
        highsLogDev(log_options,kInfo,"     Minimum %svalue is %10.4g",dVar13,local_60[0]);
        dVar12 = (double)mu;
        if (mu < 1) {
          highsLogDev(log_options,kInfo,"\n");
        }
        else {
          highsLogDev(log_options,kInfo,"  corresponding to  %10d / %10d\n",
                      (ulong)(uint)(int)(dVar13 * dVar12),(ulong)(uint)mu);
        }
        highsLogDev(log_options,kInfo,"     Maximum %svalue is %10.4g",
                    value_distribution->max_value_,local_60[0]);
        if (mu < 1) {
          highsLogDev(log_options,kInfo,"\n");
        }
        else {
          highsLogDev(log_options,kInfo,"  corresponding to  %10d / %10d\n",
                      (ulong)(uint)(int)(value_distribution->max_value_ * dVar12),(ulong)(uint)mu);
        }
        uVar9 = value_distribution->num_zero_;
        dVar13 = (double)(int)uVar10;
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) are %10.4g\n",0,(ulong)uVar9,
                      local_60[0],(ulong)(uint)(int)(((double)(int)uVar9 * 100.0) / dVar13));
        }
        uVar2 = *(value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar2 != 0) {
          highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) in (%10.4g, %10.4g)",0,
                      *(value_distribution->limit_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,(ulong)uVar2,local_60[0],
                      (ulong)(uint)(int)(((double)(int)uVar2 * 100.0) / dVar13));
          uVar9 = uVar2 + uVar9;
          if (mu < 1) {
            highsLogDev(log_options,kInfo,"\n");
          }
          else {
            highsLogDev(log_options,kInfo," corresponding to (%10d, %10d)\n",0,
                        (ulong)(uint)(int)(*(value_distribution->limit_).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start * dVar12));
          }
        }
        bVar6 = true;
        if (1 < (int)uVar1) {
          local_38 = uVar11 - 1;
          bVar6 = true;
          lVar8 = 0;
          do {
            if ((bVar6) &&
               (1.0 <= (value_distribution->limit_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8])) {
              uVar2 = value_distribution->num_one_;
              if (uVar2 == 0) {
                bVar6 = false;
              }
              else {
                highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) are             %10.4g",
                            0x3ff0000000000000,(ulong)uVar2,local_60[0],
                            (ulong)(uint)(int)(((double)(int)uVar2 * 100.0) / dVar13));
                uVar9 = uVar2 + uVar9;
                bVar6 = false;
                if (mu < 1) {
                  highsLogDev(log_options,kInfo,"\n");
                }
                else {
                  highsLogDev(log_options,kInfo," corresponding to %10d\n");
                }
              }
            }
            uVar2 = (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar8 + 1];
            if (uVar2 != 0) {
              pdVar5 = (value_distribution->limit_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) in [%10.4g, %10.4g)",
                          pdVar5[lVar8],pdVar5[lVar8 + 1],(ulong)uVar2,local_60[0],
                          (ulong)(uint)(int)(((double)(int)uVar2 * 100.0) / dVar13));
              uVar9 = uVar2 + uVar9;
              if (mu < 1) {
                highsLogDev(log_options,kInfo,"\n");
              }
              else {
                pdVar5 = (value_distribution->limit_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                highsLogDev(log_options,kInfo," corresponding to [%10d, %10d)\n",
                            (ulong)(uint)(int)(pdVar5[lVar8] * dVar12),
                            (ulong)(uint)(int)(pdVar5[lVar8 + 1] * dVar12));
              }
            }
            lVar8 = lVar8 + 1;
          } while (local_38 != lVar8);
        }
        if ((bVar6) &&
           (1.0 <= (value_distribution->limit_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11 - 1])) {
          uVar2 = value_distribution->num_one_;
          if (uVar2 == 0) {
            bVar6 = false;
          }
          else {
            highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) are             %10.4g",
                        0x3ff0000000000000,(ulong)uVar2,local_60[0],
                        (ulong)(uint)(int)(((double)(int)uVar2 * 100.0) / dVar13));
            uVar9 = uVar2 + uVar9;
            bVar6 = false;
            if (mu < 1) {
              highsLogDev(log_options,kInfo,"\n");
            }
            else {
              highsLogDev(log_options,kInfo,"  corresponding to  %10d\n");
            }
          }
        }
        uVar2 = (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        if (uVar2 != 0) {
          highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) in [%10.4g,        inf)",
                      (value_distribution->limit_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)(int)uVar1 + -1],(ulong)uVar2,
                      local_60[0],(ulong)(uint)(int)(((double)(int)uVar2 * 100.0) / dVar13));
          uVar9 = uVar2 + uVar9;
          if (mu < 1) {
            highsLogDev(log_options,kInfo,"\n");
          }
          else {
            highsLogDev(log_options,kInfo," corresponding to [%10d,        inf)\n",
                        (ulong)(uint)(int)(dVar12 * (value_distribution->limit_).
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)(int)uVar1 + -1]));
          }
        }
        if ((bVar6) && (uVar1 = value_distribution->num_one_, uVar1 != 0)) {
          highsLogDev(log_options,kInfo,"%12d %svalues (%3d%%) are             %10.4g",
                      0x3ff0000000000000,(ulong)uVar1,local_60[0],
                      (ulong)(uint)(int)(((double)(int)uVar1 * 100.0) / dVar13));
          uVar9 = uVar1 + uVar9;
          if (mu < 1) {
            highsLogDev(log_options,kInfo,"\n");
          }
          else {
            highsLogDev(log_options,kInfo,"  corresponding to  %10d\n");
          }
        }
        highsLogDev(log_options,kInfo,"%12d %svalues\n",(ulong)uVar10,local_60[0]);
        if (uVar9 != uVar10) {
          highsLogDev(log_options,kInfo,"ERROR: %d = sum_report_count != sum_count = %d\n",
                      (ulong)uVar9,(ulong)uVar10);
        }
      }
      if (local_60[0] != local_50) {
        operator_delete(local_60[0]);
      }
      return (bool)(undefined1)local_3c;
    }
  }
  return false;
}

Assistant:

bool logValueDistribution(const HighsLogOptions& log_options,
                          const HighsValueDistribution& value_distribution,
                          const HighsInt mu) {
  if (value_distribution.sum_count_ <= 0) return false;
  const HighsInt num_count = value_distribution.num_count_;
  if (num_count < 0) return false;
  if (value_distribution.distribution_name_ != "")
    highsLogDev(log_options, HighsLogType::kInfo, "\n%s\n",
                value_distribution.distribution_name_.c_str());
  std::string value_name = value_distribution.value_name_;
  bool not_reported_ones = true;
  HighsInt sum_count =
      value_distribution.num_zero_ + value_distribution.num_one_;
  const double min_value = value_distribution.min_value_;
  for (HighsInt i = 0; i < num_count + 1; i++)
    sum_count += value_distribution.count_[i];
  if (!sum_count) return false;
  highsLogDev(log_options, HighsLogType::kInfo, "Min value = %g\n", min_value);
  highsLogDev(log_options, HighsLogType::kInfo,
              "     Minimum %svalue is %10.4g", value_name.c_str(), min_value);
  if (mu > 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "  corresponding to  %10" HIGHSINT_FORMAT
                " / %10" HIGHSINT_FORMAT "\n",
                (HighsInt)(min_value * mu), mu);
  } else {
    highsLogDev(log_options, HighsLogType::kInfo, "\n");
  }
  highsLogDev(log_options, HighsLogType::kInfo,
              "     Maximum %svalue is %10.4g", value_name.c_str(),
              value_distribution.max_value_);
  if (mu > 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "  corresponding to  %10" HIGHSINT_FORMAT
                " / %10" HIGHSINT_FORMAT "\n",
                (HighsInt)(value_distribution.max_value_ * mu), mu);
  } else {
    highsLogDev(log_options, HighsLogType::kInfo, "\n");
  }
  HighsInt sum_report_count = 0;
  double percentage;
  HighsInt int_percentage;
  HighsInt count = value_distribution.num_zero_;
  if (count) {
    percentage = doublePercentage(count, sum_count);
    int_percentage = percentage;
    highsLogDev(log_options, HighsLogType::kInfo,
                "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                "%%) are %10.4g\n",
                count, value_name.c_str(), int_percentage, 0.0);
    sum_report_count += count;
  }
  count = value_distribution.count_[0];
  if (count) {
    percentage = doublePercentage(count, sum_count);
    int_percentage = percentage;
    highsLogDev(log_options, HighsLogType::kInfo,
                "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                "%%) in (%10.4g, %10.4g)",
                count, value_name.c_str(), int_percentage, 0.0,
                value_distribution.limit_[0]);
    sum_report_count += count;
    if (mu > 0) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  " corresponding to (%10" HIGHSINT_FORMAT
                  ", %10" HIGHSINT_FORMAT ")\n",
                  0, (HighsInt)(value_distribution.limit_[0] * mu));
    } else {
      highsLogDev(log_options, HighsLogType::kInfo, "\n");
    }
  }
  for (HighsInt i = 1; i < num_count; i++) {
    if (not_reported_ones && value_distribution.limit_[i - 1] >= 1.0) {
      count = value_distribution.num_one_;
      if (count) {
        percentage = doublePercentage(count, sum_count);
        int_percentage = percentage;
        highsLogDev(log_options, HighsLogType::kInfo,
                    "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                    "%%) are             %10.4g",
                    count, value_name.c_str(), int_percentage, 1.0);
        sum_report_count += count;
        if (mu > 0) {
          highsLogDev(log_options, HighsLogType::kInfo,
                      " corresponding to %10" HIGHSINT_FORMAT "\n", mu);
        } else {
          highsLogDev(log_options, HighsLogType::kInfo, "\n");
        }
      }
      not_reported_ones = false;
    }
    count = value_distribution.count_[i];
    if (count) {
      percentage = doublePercentage(count, sum_count);
      int_percentage = percentage;
      highsLogDev(log_options, HighsLogType::kInfo,
                  "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                  "%%) in [%10.4g, %10.4g)",
                  count, value_name.c_str(), int_percentage,
                  value_distribution.limit_[i - 1],
                  value_distribution.limit_[i]);
      sum_report_count += count;
      if (mu > 0) {
        highsLogDev(log_options, HighsLogType::kInfo,
                    " corresponding to [%10" HIGHSINT_FORMAT
                    ", %10" HIGHSINT_FORMAT ")\n",
                    (HighsInt)(value_distribution.limit_[i - 1] * mu),
                    (HighsInt)(value_distribution.limit_[i] * mu));
      } else {
        highsLogDev(log_options, HighsLogType::kInfo, "\n");
      }
    }
  }
  if (not_reported_ones && value_distribution.limit_[num_count - 1] >= 1.0) {
    count = value_distribution.num_one_;
    if (count) {
      percentage = doublePercentage(count, sum_count);
      int_percentage = percentage;
      highsLogDev(log_options, HighsLogType::kInfo,
                  "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                  "%%) are             %10.4g",
                  count, value_name.c_str(), int_percentage, 1.0);
      sum_report_count += count;
      if (mu > 0) {
        highsLogDev(log_options, HighsLogType::kInfo,
                    "  corresponding to  %10" HIGHSINT_FORMAT "\n", mu);
      } else {
        highsLogDev(log_options, HighsLogType::kInfo, "\n");
      }
    }
    not_reported_ones = false;
  }
  count = value_distribution.count_[num_count];
  if (count) {
    percentage = doublePercentage(count, sum_count);
    int_percentage = percentage;
    highsLogDev(log_options, HighsLogType::kInfo,
                "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                "%%) in [%10.4g,        inf)",
                count, value_name.c_str(), int_percentage,
                value_distribution.limit_[num_count - 1]);
    sum_report_count += count;
    if (mu > 0) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  " corresponding to [%10" HIGHSINT_FORMAT ",        inf)\n",
                  (HighsInt)(value_distribution.limit_[num_count - 1] * mu));
    } else {
      highsLogDev(log_options, HighsLogType::kInfo, "\n");
    }
  }
  if (not_reported_ones) {
    count = value_distribution.num_one_;
    if (count) {
      percentage = doublePercentage(count, sum_count);
      int_percentage = percentage;
      highsLogDev(log_options, HighsLogType::kInfo,
                  "%12" HIGHSINT_FORMAT " %svalues (%3" HIGHSINT_FORMAT
                  "%%) are             %10.4g",
                  count, value_name.c_str(), int_percentage, 1.0);
      sum_report_count += count;
      if (mu > 0) {
        highsLogDev(log_options, HighsLogType::kInfo,
                    "  corresponding to  %10" HIGHSINT_FORMAT "\n", mu);
      } else {
        highsLogDev(log_options, HighsLogType::kInfo, "\n");
      }
    }
  }
  highsLogDev(log_options, HighsLogType::kInfo,
              "%12" HIGHSINT_FORMAT " %svalues\n", sum_count,
              value_name.c_str());
  if (sum_report_count != sum_count)
    highsLogDev(log_options, HighsLogType::kInfo,
                "ERROR: %" HIGHSINT_FORMAT
                " = sum_report_count != sum_count = %" HIGHSINT_FORMAT "\n",
                sum_report_count, sum_count);
  return true;
}